

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

endpoint __thiscall booster::aio::basic_socket::local_endpoint(basic_socket *this,error_code *e)

{
  native_type __fd;
  int iVar1;
  size_type sVar2;
  undefined8 *in_RDX;
  basic_io_device *in_RSI;
  copy_ptr<booster::aio::endpoint::data> in_RDI;
  error_code eVar3;
  socklen_t len;
  sockaddr *sa;
  vector<char,_std::allocator<char>_> endpoint_raw_;
  endpoint *ep;
  error_category *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  value_type_conflict1 *in_stack_ffffffffffffff60;
  vector<char,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  copy_ptr<booster::aio::endpoint::data> this_01;
  undefined4 uStack_64;
  socklen_t local_54;
  sockaddr *local_50;
  allocator<char> local_32;
  undefined1 local_31;
  vector<char,_std::allocator<char>_> local_30;
  undefined8 *local_18;
  
  local_31 = 0;
  this_01.ptr_ = in_RDI.ptr_;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)this_01.ptr_,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60
             ,(allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<char>::~allocator(&local_32);
  this_00 = &local_30;
  local_50 = (sockaddr *)
             std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(this_00);
  local_54 = (socklen_t)sVar2;
  __fd = basic_io_device::native(in_RSI);
  iVar1 = getsockname(__fd,local_50,&local_54);
  if (iVar1 < 0) {
    eVar3 = socket_details::geterror();
    in_stack_ffffffffffffff50 = eVar3._M_cat;
    in_stack_ffffffffffffff5c = eVar3._M_value;
    *local_18 = CONCAT44(uStack_64,in_stack_ffffffffffffff5c);
    local_18[1] = in_stack_ffffffffffffff50;
  }
  iVar1 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  endpoint::endpoint((endpoint *)this_00);
  endpoint::raw((endpoint *)this_00,
                (sockaddr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),iVar1);
  std::vector<char,_std::allocator<char>_>::~vector(this_00);
  return (endpoint)(copy_ptr<booster::aio::endpoint::data>)in_RDI.ptr_;
}

Assistant:

endpoint basic_socket::local_endpoint(system::error_code &e)
{
	std::vector<char> endpoint_raw_(1000,0);
	sockaddr *sa = reinterpret_cast<sockaddr *>(&endpoint_raw_.front());
	socklen_t len = endpoint_raw_.size();
	if(::getsockname(native(),sa,&len) < 0)
		e=geterror();
	endpoint ep;
	ep.raw(sa,len);
	return ep;
}